

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tape.cpp
# Opt level: O2

void __thiscall Storage::Tape::TapePlayer::process_next_event(TapePlayer *this)

{
  (*(this->super_TimedEventLoop)._vptr_TimedEventLoop[5])(this,&this->current_pulse_);
  get_next_pulse(this);
  return;
}

Assistant:

void TapePlayer::process_next_event() {
	process_input_pulse(current_pulse_);
	get_next_pulse();
}